

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall
llm_tokenizer_bpe_session::~llm_tokenizer_bpe_session(llm_tokenizer_bpe_session *this)

{
  pointer plVar1;
  
  llama_vocab::std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>::~vector
            ((vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_> *)&this->work_queue);
  plVar1 = (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)(this->symbols_final).
                                 super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)plVar1);
  }
  plVar1 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)(this->symbols).
                                 super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)plVar1);
    return;
  }
  return;
}

Assistant:

static void append(const llama_token token_id, std::vector<llama_token> & output)  {
        output.push_back(token_id);
    }